

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCheck.c
# Opt level: O2

int Ivy_ManCheck(Ivy_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Ivy_Obj_t *pObj;
  int *piVar5;
  Ivy_Obj_t *pIVar6;
  int *piVar7;
  uint uVar8;
  char *pcVar9;
  
  uVar8 = 0;
  do {
    if (p->vObjs->nSize <= (int)uVar8) {
      iVar4 = Ivy_TableCountEntries(p);
      if (iVar4 == p->nObjs[6] + p->nObjs[5] + p->nObjs[4]) {
        iVar4 = Ivy_ManIsAcyclic(p);
        uVar8 = (uint)(iVar4 != 0);
      }
      else {
        puts("Ivy_ManCheck: The number of nodes in the structural hashing table is wrong.");
        uVar8 = 0;
      }
      return uVar8;
    }
    pObj = (Ivy_Obj_t *)Vec_PtrEntry(p->vObjs,uVar8);
    if (pObj == (Ivy_Obj_t *)0x0) goto LAB_006414c3;
    if (uVar8 != pObj->Id) {
      printf("Ivy_ManCheck: Node with ID %d is listed as number %d in the array of objects.\n",
             (ulong)(uint)pObj->Id,(ulong)uVar8);
      return 0;
    }
    if (uVar8 == 0) {
switchD_00641355_caseD_1:
      if ((((pObj->pFanin0 != (Ivy_Obj_t *)0x0) &&
           (*(int *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe) != 0)) ||
          ((pObj->pFanin1 != (Ivy_Obj_t *)0x0 &&
           (*(int *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe) != 0)))) ||
         (0x7ff < *(uint *)&pObj->field_0x8)) {
        pcVar9 = "Ivy_ManCheck: The AIG has non-standard constant or PI node with ID \"%d\".\n";
LAB_00641504:
        printf(pcVar9,(ulong)uVar8);
        return 0;
      }
    }
    else {
      uVar1 = *(uint *)&pObj->field_0x8;
      switch(uVar1 & 0xf) {
      case 1:
        goto switchD_00641355_caseD_1;
      case 2:
        if ((pObj->pFanin1 != (Ivy_Obj_t *)0x0) &&
           (*(int *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe) != 0)) {
          pcVar9 = "Ivy_ManCheck: The AIG has non-standard PO node with ID \"%d\".\n";
          goto LAB_00641504;
        }
        break;
      default:
        piVar7 = (int *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
        if (piVar7 != (int *)0x0) {
          piVar5 = (int *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
          if (piVar5 != (int *)0x0) {
            iVar3 = 0;
            iVar4 = 0;
            if (pObj->pFanin0 != (Ivy_Obj_t *)0x0) {
              iVar4 = *piVar7;
            }
            if (pObj->pFanin1 != (Ivy_Obj_t *)0x0) {
              iVar3 = *piVar5;
            }
            if (iVar3 <= iVar4) {
              pcVar9 = "Ivy_ManCheck: The AIG has node \"%d\" with a wrong ordering of fanins.\n";
              goto LAB_00641504;
            }
            uVar2 = Ivy_ObjLevelNew(pObj);
            if (uVar1 >> 0xb != uVar2) {
              printf("Ivy_ManCheck: Node with ID \"%d\" has level %d but should have level %d.\n",
                     (ulong)uVar8,(ulong)(uVar1 >> 0xb));
            }
            pIVar6 = Ivy_TableLookup(p,pObj);
            if (pIVar6 != pObj) {
              printf("Ivy_ManCheck: Node with ID \"%d\" is not in the structural hashing table.\n",
                     (ulong)(uint)pObj->Id);
            }
            if (pObj->nRefs == 0) {
              printf("Ivy_ManCheck: Node with ID \"%d\" has no fanouts.\n",(ulong)(uint)pObj->Id);
            }
            if (p->fFanout != 0) {
              iVar4 = pObj->nRefs;
              iVar3 = Ivy_ObjFanoutNum(p,pObj);
              pcVar9 = 
              "Ivy_ManCheck: Node with ID \"%d\" has mismatch between the number of fanouts and refs.\n"
              ;
              if (iVar4 != iVar3) goto LAB_006414b9;
            }
            break;
          }
        }
        pcVar9 = "Ivy_ManCheck: The AIG has internal node \"%d\" with a NULL fanin.\n";
        goto LAB_00641504;
      case 4:
        if ((Ivy_Obj_t *)0x1 < pObj->pFanin1) {
          pcVar9 = "Ivy_ManCheck: The latch with ID \"%d\" contains second fanin.\n";
          goto LAB_00641504;
        }
        if ((uVar1 & 0x600) == 0) {
          pcVar9 = "Ivy_ManCheck: The latch with ID \"%d\" does not have initial state.\n";
          goto LAB_00641504;
        }
        pIVar6 = Ivy_TableLookup(p,pObj);
        pcVar9 = "Ivy_ManCheck: Latch with ID \"%d\" is not in the structural hashing table.\n";
        if (pIVar6 != pObj) {
LAB_006414b9:
          printf(pcVar9,(ulong)(uint)pObj->Id);
        }
        break;
      case 7:
        if ((Ivy_Obj_t *)0x1 < pObj->pFanin1) {
          pcVar9 = "Ivy_ManCheck: The buffer with ID \"%d\" contains second fanin.\n";
          goto LAB_00641504;
        }
      }
    }
LAB_006414c3:
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Checks the consistency of the AIG manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Ivy_ManCheck( Ivy_Man_t * p )
{
    Ivy_Obj_t * pObj, * pObj2;
    int i;
    Ivy_ManForEachObj( p, pObj, i )
    {
        // skip deleted nodes
        if ( Ivy_ObjId(pObj) != i )
        {
            printf( "Ivy_ManCheck: Node with ID %d is listed as number %d in the array of objects.\n", pObj->Id, i );
            return 0;
        }
        // consider the constant node and PIs
        if ( i == 0 || Ivy_ObjIsPi(pObj) )
        {
            if ( Ivy_ObjFaninId0(pObj) || Ivy_ObjFaninId1(pObj) || Ivy_ObjLevel(pObj) )
            {
                printf( "Ivy_ManCheck: The AIG has non-standard constant or PI node with ID \"%d\".\n", pObj->Id );
                return 0;
            }
            continue;
        }
        if ( Ivy_ObjIsPo(pObj) )
        {
            if ( Ivy_ObjFaninId1(pObj) )
            {
                printf( "Ivy_ManCheck: The AIG has non-standard PO node with ID \"%d\".\n", pObj->Id );
                return 0;
            }
            continue;
        }
        if ( Ivy_ObjIsBuf(pObj) )
        {
            if ( Ivy_ObjFanin1(pObj) )
            {
                printf( "Ivy_ManCheck: The buffer with ID \"%d\" contains second fanin.\n", pObj->Id );
                return 0;
            }
            continue;
        }
        if ( Ivy_ObjIsLatch(pObj) )
        {
            if ( Ivy_ObjFanin1(pObj) )
            {
                printf( "Ivy_ManCheck: The latch with ID \"%d\" contains second fanin.\n", pObj->Id );
                return 0;
            }
            if ( Ivy_ObjInit(pObj) == IVY_INIT_NONE )
            {
                printf( "Ivy_ManCheck: The latch with ID \"%d\" does not have initial state.\n", pObj->Id );
                return 0;
            }
            pObj2 = Ivy_TableLookup( p, pObj );
            if ( pObj2 != pObj )
                printf( "Ivy_ManCheck: Latch with ID \"%d\" is not in the structural hashing table.\n", pObj->Id );
            continue;
        }
        // consider the AND node
        if ( !Ivy_ObjFanin0(pObj) || !Ivy_ObjFanin1(pObj) )
        {
            printf( "Ivy_ManCheck: The AIG has internal node \"%d\" with a NULL fanin.\n", pObj->Id );
            return 0;
        }
        if ( Ivy_ObjFaninId0(pObj) >= Ivy_ObjFaninId1(pObj) )
        {
            printf( "Ivy_ManCheck: The AIG has node \"%d\" with a wrong ordering of fanins.\n", pObj->Id );
            return 0;
        }
        if ( Ivy_ObjLevel(pObj) != Ivy_ObjLevelNew(pObj) )
            printf( "Ivy_ManCheck: Node with ID \"%d\" has level %d but should have level %d.\n", pObj->Id, Ivy_ObjLevel(pObj), Ivy_ObjLevelNew(pObj) );
        pObj2 = Ivy_TableLookup( p, pObj );
        if ( pObj2 != pObj )
            printf( "Ivy_ManCheck: Node with ID \"%d\" is not in the structural hashing table.\n", pObj->Id );
        if ( Ivy_ObjRefs(pObj) == 0 )
            printf( "Ivy_ManCheck: Node with ID \"%d\" has no fanouts.\n", pObj->Id );
        // check fanouts
        if ( p->fFanout && Ivy_ObjRefs(pObj) != Ivy_ObjFanoutNum(p, pObj) )
            printf( "Ivy_ManCheck: Node with ID \"%d\" has mismatch between the number of fanouts and refs.\n", pObj->Id );
    }
    // count the number of nodes in the table
    if ( Ivy_TableCountEntries(p) != Ivy_ManAndNum(p) + Ivy_ManExorNum(p) + Ivy_ManLatchNum(p) )
    {
        printf( "Ivy_ManCheck: The number of nodes in the structural hashing table is wrong.\n" );
        return 0;
    }
//    if ( !Ivy_ManCheckFanouts(p) )
//        return 0;
    if ( !Ivy_ManIsAcyclic(p) )
        return 0;
    return 1; 
}